

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_Nonlin4RecordState
               (Aig_Man_t *pAig,Vec_Int_t *vOrder,uint *pState,char *pValues,int fBackward)

{
  int iVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar2;
  int i;
  uint i_00;
  
  for (i_00 = 0; (int)i_00 < pAig->nRegs; i_00 = i_00 + 1) {
    pObj = Saig_ManLi(pAig,i_00);
    pAVar2 = Saig_ManLo(pAig,i_00);
    if (fBackward == 0) {
      pObj = pAVar2;
    }
    iVar1 = Llb_ObjBddVar(vOrder,pObj);
    if (pValues[iVar1] == '\x01') {
      pState[i_00 >> 5] = pState[i_00 >> 5] | 1 << ((byte)i_00 & 0x1f);
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4RecordState( Aig_Man_t * pAig, Vec_Int_t * vOrder, unsigned * pState, char * pValues, int fBackward )
{
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        if ( pValues[Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo)] == 1 )
            Abc_InfoSetBit( pState, i );
}